

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

TimerId __thiscall
sznet::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  Timer *pTVar1;
  int64_t seq;
  TimerQueue *local_d8;
  code *local_d0;
  undefined8 local_c8;
  type local_c0;
  Functor local_a0;
  undefined1 local_79;
  TimerQueue *local_78;
  function<void_()> local_60;
  Timer *local_40;
  Timer *timer;
  double interval_local;
  TimerCallback *cb_local;
  TimerQueue *this_local;
  Timestamp when_local;
  
  timer = (Timer *)interval;
  interval_local = (double)cb;
  cb_local = (TimerCallback *)this;
  this_local = (TimerQueue *)when.m_microSecondsSinceEpoch;
  pTVar1 = (Timer *)operator_new(0x48);
  local_79 = 1;
  std::function<void_()>::function(&local_60,cb);
  local_78 = this_local;
  Timer::Timer(pTVar1,&local_60,(Timestamp)this_local,(double)timer);
  local_79 = 0;
  std::function<void_()>::~function(&local_60);
  this_00 = this->m_loop;
  local_d0 = addTimerInLoop;
  local_c8 = 0;
  local_d8 = this;
  local_40 = pTVar1;
  std::bind<void(sznet::TimerQueue::*)(sznet::Timer*),sznet::TimerQueue*,sznet::Timer*&>
            (&local_c0,(offset_in_TimerQueue_to_subr *)&local_d0,&local_d8,&local_40);
  std::function<void()>::
  function<std::_Bind<void(sznet::TimerQueue::*(sznet::TimerQueue*,sznet::Timer*))(sznet::Timer*)>,void>
            ((function<void()> *)&local_a0,&local_c0);
  sznet::net::EventLoop::runInLoop(this_00,&local_a0);
  std::function<void_()>::~function(&local_a0);
  pTVar1 = local_40;
  seq = Timer::sequence(local_40);
  TimerId::TimerId((TimerId *)&when_local,pTVar1,seq);
  return _when_local;
}

Assistant:

TimerId TimerQueue::addTimer(const net::TimerCallback cb, Timestamp when, double interval)
{
	Timer* timer = new Timer(cb, when, interval);
	m_loop->runInLoop(std::bind(&TimerQueue::addTimerInLoop, this, timer));
	return TimerId(timer, timer->sequence());
}